

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall cmGlobalUnixMakefileGenerator3::Generate(cmGlobalUnixMakefileGenerator3 *this)

{
  _Rb_tree_header *p_Var1;
  cmLocalGenerator *this_00;
  cmGeneratedFileStream *pcVar2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  pointer ppcVar6;
  char *pcVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  iterator pmi;
  unsigned_long total;
  string markFileName;
  unsigned_long current;
  cmGeneratedFileStream markFile;
  long *local_2a0 [2];
  long local_290 [2];
  unsigned_long local_280;
  allocator local_278 [584];
  
  cmGlobalGenerator::Generate((cmGlobalGenerator *)this);
  p_Var1 = &(this->ProgressMap)._M_t._M_impl.super__Rb_tree_header;
  total = 0;
  p_Var5 = (this->ProgressMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var4 = p_Var5; (_Rb_tree_header *)p_Var4 != p_Var1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    total = (long)&(p_Var4[1]._M_parent)->_M_color + total;
  }
  local_280 = 0;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      TargetProgress::WriteProgressVariables
                ((TargetProgress *)&p_Var5[1]._M_parent,total,&local_280);
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  ppcVar6 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar6) {
    uVar9 = 0;
    uVar10 = 1;
    do {
      this_00 = ppcVar6[uVar9];
      pcVar7 = cmLocalGenerator::GetCurrentBinaryDirectory(this_00);
      std::__cxx11::string::string((string *)local_2a0,pcVar7,local_278);
      std::__cxx11::string::append((char *)local_2a0);
      std::__cxx11::string::append((char *)local_2a0);
      std::__cxx11::string::append((char *)local_2a0);
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_278,(char *)local_2a0[0],false,None);
      CountProgressMarksInAll(this,this_00);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_278);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
      if (local_2a0[0] != local_290) {
        operator_delete(local_2a0[0],local_290[0] + 1);
      }
      ppcVar6 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar3 = uVar10 < (ulong)((long)(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                                     LocalGenerators.
                                     super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar6 >> 3
                              );
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar3);
  }
  WriteMainMakefile2(this);
  WriteMainCMakefile(this);
  pcVar2 = this->CommandDatabase;
  if (pcVar2 != (cmGeneratedFileStream *)0x0) {
    std::ios::widen((char)(pcVar2->super_ofstream).
                          super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]
                    + (char)pcVar2);
    std::ostream::put((char)pcVar2);
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
    if (this->CommandDatabase != (cmGeneratedFileStream *)0x0) {
      (*(this->CommandDatabase->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
        _vptr_basic_ostream[1])();
    }
    this->CommandDatabase = (cmGeneratedFileStream *)0x0;
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::Generate()
{
  // first do superclass method
  this->cmGlobalGenerator::Generate();

  // initialize progress
  unsigned long total = 0;
  for (ProgressMapType::const_iterator pmi = this->ProgressMap.begin();
       pmi != this->ProgressMap.end(); ++pmi) {
    total += pmi->second.NumberOfActions;
  }

  // write each target's progress.make this loop is done twice. Bascially the
  // Generate pass counts all the actions, the first loop below determines
  // how many actions have progress updates for each target and writes to
  // corrrect variable values for everything except the all targets. The
  // second loop actually writes out correct values for the all targets as
  // well. This is because the all targets require more information that is
  // computed in the first loop.
  unsigned long current = 0;
  for (ProgressMapType::iterator pmi = this->ProgressMap.begin();
       pmi != this->ProgressMap.end(); ++pmi) {
    pmi->second.WriteProgressVariables(total, current);
  }
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    cmLocalGenerator* lg = this->LocalGenerators[i];
    std::string markFileName = lg->GetCurrentBinaryDirectory();
    markFileName += "/";
    markFileName += cmake::GetCMakeFilesDirectory();
    markFileName += "/progress.marks";
    cmGeneratedFileStream markFile(markFileName.c_str());
    markFile << this->CountProgressMarksInAll(lg) << "\n";
  }

  // write the main makefile
  this->WriteMainMakefile2();
  this->WriteMainCMakefile();

  if (this->CommandDatabase != CM_NULLPTR) {
    *this->CommandDatabase << std::endl << "]";
    delete this->CommandDatabase;
    this->CommandDatabase = CM_NULLPTR;
  }
}